

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execNegEa<(moira::Instr)83,(moira::Mode)8,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  bool error;
  bool local_19;
  
  addr = computeEA<(moira::Mode)8,(moira::Size)4,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,addr,&local_19);
  if (local_19 == false) {
    uVar4 = -(ulong)uVar1;
    bVar2 = (bool)((byte)(uVar4 >> 0x20) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    uVar3 = (uint)uVar4;
    (this->reg).sr.v = (int)(uVar3 & uVar1) < 0;
    (this->reg).sr.z = uVar3 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0x1f) & 1);
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,(uint)(uVar4 >> 0x10) & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr + 2,uVar3 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}